

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenuSloppyState::timeout(QMenuSloppyState *this)

{
  QMenuPrivate *this_00;
  Data *pDVar1;
  QMenu *pQVar2;
  char cVar3;
  QObject *pQVar4;
  QObject *pQVar5;
  QAction *action;
  long in_FS_OFFSET;
  QPoint lastCursorPos;
  QRect local_40;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->m_menu->super_QWidget).field_0x8;
  if ((*(ushort *)&this_00->field_0x420 & 0x40) == 0) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = (undefined1 *)QGuiApplicationPrivate::QLastCursorPosition::toPoint();
    local_40 = QWidget::frameGeometry(&this->m_menu->super_QWidget);
    cVar3 = QRect::contains((QPoint *)&local_40,SUB81(&local_30,0));
  }
  else {
    cVar3 = (char)((*(ushort *)&this_00->field_0x420 & 0x40) >> 6);
  }
  if (((this_00->currentAction == this->m_reset_action) &&
      (this_00->currentAction != (QAction *)0x0)) && (cVar3 != '\0')) {
    QAction::menuObject();
    pQVar4 = (QObject *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    pDVar1 = (this_00->activeMenu).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = (this_00->activeMenu).wp.value;
    }
    if (pQVar5 == pQVar4) goto LAB_0045f918;
  }
  this->m_init_guard = false;
  if ((((this->m_parent == (QMenuSloppyState *)0x0) ||
       (pQVar2 = this->m_parent->m_menu, pQVar2 == (QMenu *)0x0)) ||
      (*(int *)(*(long *)&(pQVar2->super_QWidget).field_0x8 + 0x2a0) == 0)) &&
     ((((this->m_menu->super_QWidget).data)->widget_attributes & 0x8000) != 0)) {
    pDVar1 = (this->m_sub_menu).wp.d;
    if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
       ((this->m_sub_menu).wp.value != (QObject *)0x0)) {
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar4 = (QObject *)0x0;
      }
      else {
        pQVar4 = (this->m_sub_menu).wp.value;
      }
      QMenuPrivate::hideMenu(this_00,(QMenu *)pQVar4);
    }
    if (cVar3 == '\0') {
      action = (QAction *)0x0;
    }
    else {
      if ((this->field_0x6c & 0x20) == 0) goto LAB_0045f90a;
      action = this->m_reset_action;
    }
    QMenuPrivate::setCurrentAction(this_00,action,0,SelectedFromElsewhere,false);
  }
LAB_0045f90a:
  if (this->m_init_guard == false) {
    reset(this);
  }
LAB_0045f918:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuSloppyState::timeout()
{
    QMenuPrivate *menu_priv = QMenuPrivate::get(m_menu);

    bool reallyHasMouse = menu_priv->hasReceievedEnter;
    if (!reallyHasMouse) {
        // Check whether the menu really has a mouse, because only active popup
        // menu gets the enter/leave events. Currently Cocoa is an exception.
        const QPoint lastCursorPos = QGuiApplicationPrivate::lastCursorPosition.toPoint();
        reallyHasMouse = m_menu->frameGeometry().contains(lastCursorPos);
    }

    if (menu_priv->currentAction == m_reset_action
            && reallyHasMouse
            && (menu_priv->currentAction
                && menu_priv->currentAction->menu() == menu_priv->activeMenu)) {
        return;
    }

    ResetOnDestroy resetState(this, &m_init_guard);

    if (hasParentActiveDelayTimer() || !m_menu->isVisible())
        return;

    if (m_sub_menu)
        menu_priv->hideMenu(m_sub_menu);

    if (reallyHasMouse) {
        if (m_use_reset_action)
            menu_priv->setCurrentAction(m_reset_action, 0);
    } else {
        menu_priv->setCurrentAction(nullptr, 0);
    }
}